

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

GCproto * fs_finish(LexState *ls,BCLine line)

{
  uint8_t *puVar1;
  SBuf *sb;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  BCPos BVar8;
  FuncState *fs;
  lua_State *L;
  BCInsLine *pBVar9;
  VarInfo *pVVar10;
  GCtab *pGVar11;
  TValue *pTVar12;
  uint uVar13;
  uint uVar14;
  BCPos BVar15;
  long lVar16;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar17;
  uint32_t uVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  GCSize size;
  char *pcVar26;
  ulong uVar27;
  ushort uVar28;
  MSize MVar29;
  void *pvVar30;
  int iVar31;
  ulong uVar32;
  VarInfo *pVVar33;
  long lVar34;
  long lVar35;
  GCobj *v;
  
  fs = ls->fs;
  iVar31 = line - fs->linedefined;
  L = ls->L;
  uVar4 = fs->pc;
  if (((uVar4 <= fs->lasttarget) || (uVar13 = (byte)fs->bcbase[uVar4 - 1].ins - 0x43, 9 < uVar13))
     || ((0x3c3U >> (uVar13 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((1 < uVar4) && ((fs->flags & 0x40) != 0)) {
    iVar24 = 0x7ffe;
    lVar35 = 0;
    do {
      uVar13 = fs->bcbase[lVar35 + 1].ins;
      uVar14 = (uVar13 & 0xff) - 0x33;
      if (uVar14 < 0x1a) {
        if ((0x3c30000U >> (uVar14 & 0x1f) & 1) == 0) {
          if (uVar14 == 0) break;
        }
        else {
          BVar15 = bcemit_INS(fs,uVar13);
          pBVar9 = fs->bcbase;
          pBVar9[BVar15].line = pBVar9[lVar35 + 1].line;
          if (0xffff < BVar15 + iVar24) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar9[lVar35 + 1].ins = (BVar15 + iVar24) * 0x10000 | 0x32;
        }
      }
      iVar24 = iVar24 + -1;
      lVar35 = lVar35 + 1;
    } while ((ulong)uVar4 - 1 != lVar35);
  }
  uVar4 = fs->pc;
  uVar13 = fs->nkn;
  uVar22 = ((ulong)fs->nkgc + (ulong)uVar4) * 4 + 0x47 & 0xfffffffffffffff8;
  lVar35 = uVar22 + (ulong)uVar13 * 8;
  bVar17 = fs->nuv;
  uVar19 = (ulong)((uint)bVar17 * 2 + 2 & 0xfffffffc);
  bVar21 = 2 - (iVar31 < 0x10000);
  if (iVar31 < 0x100) {
    bVar21 = 0;
  }
  sb = &ls->sb;
  pVVar10 = ls->vstack;
  (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
  if (bVar17 != 0) {
    uVar32 = 0;
    do {
      uVar23 = (ulong)pVVar10[fs->uvmap[uVar32]].name.gcptr32;
      uVar25 = *(int *)(uVar23 + 0xc) + 1;
      uVar14 = (ls->sb).p.ptr32;
      pcVar26 = (char *)(ulong)uVar14;
      if ((ls->sb).e.ptr32 - uVar14 < uVar25) {
        pcVar26 = lj_buf_more2(sb,uVar25);
      }
      memcpy(pcVar26,(void *)(uVar23 + 0x10),(ulong)uVar25);
      (sb->p).ptr32 = (int)pcVar26 + uVar25;
      uVar32 = uVar32 + 1;
    } while (bVar17 != uVar32);
  }
  lVar16 = uVar19 + lVar35;
  uVar5 = (ls->sb).p.ptr32;
  uVar14 = ls->vtop;
  uVar6 = (ls->sb).b.ptr32;
  if (fs->vbase < uVar14) {
    pVVar33 = pVVar10 + fs->vbase;
    BVar15 = 0;
    do {
      if ((pVVar33->info & 6) == 0) {
        uVar25 = (pVVar33->name).gcptr32;
        uVar32 = (ulong)uVar25;
        if (uVar32 < 7) {
          uVar7 = (ls->sb).p.ptr32;
          pcVar26 = (char *)(ulong)uVar7;
          if ((ls->sb).e.ptr32 - uVar7 < 0xb) {
            pcVar26 = lj_buf_more2(sb,0xb);
          }
          *pcVar26 = (char)uVar25;
          pcVar26 = pcVar26 + 1;
        }
        else {
          iVar24 = *(int *)(uVar32 + 0xc);
          MVar29 = iVar24 + 0xb;
          uVar25 = (ls->sb).p.ptr32;
          pcVar26 = (char *)(ulong)uVar25;
          if ((ls->sb).e.ptr32 - uVar25 < MVar29) {
            pcVar26 = lj_buf_more2(sb,MVar29);
          }
          uVar23 = (ulong)(iVar24 + 1);
          memcpy(pcVar26,(void *)(uVar32 + 0x10),uVar23);
          pcVar26 = pcVar26 + uVar23;
        }
        BVar8 = pVVar33->startpc;
        pcVar26 = lj_strfmt_wuleb128(pcVar26,BVar8 - BVar15);
        pcVar26 = lj_strfmt_wuleb128(pcVar26,pVVar33->endpc - BVar8);
        (sb->p).ptr32 = (uint32_t)pcVar26;
        BVar15 = BVar8;
      }
      pVVar33 = pVVar33 + 1;
    } while (pVVar33 < pVVar10 + uVar14);
  }
  lVar34 = (ulong)(uVar4 - 1 << (bVar21 & 0x1f)) + lVar16;
  uVar4 = (ls->sb).p.ptr32;
  pcVar26 = (char *)(ulong)uVar4;
  if ((ls->sb).e.ptr32 == uVar4) {
    pcVar26 = lj_buf_more2(sb,1);
  }
  uVar18 = (int)pcVar26 + 1;
  *pcVar26 = '\0';
  (ls->sb).p.ptr32 = uVar18;
  size = (int)lVar34 + (uVar18 - (ls->sb).b.ptr32);
  o = (GCobj *)lj_mem_newgco(L,size);
  (o->gch).gct = '\a';
  (o->pt).sizept = size;
  (o->pt).trace = 0;
  bVar17 = fs->flags;
  (o->pt).flags = bVar17 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar21 = fs->framesize;
  (o->gch).unused2 = bVar21;
  (o->th).openupval.gcptr32 = *(uint32_t *)&ls->chunkname;
  lVar2 = uVar22 + (long)o;
  *(undefined4 *)(lVar2 + (ulong)(fs->nkgc + 1) * -4) = 0;
  uVar4 = fs->pc;
  bVar17 = (bVar17 & 2) >> 1;
  pBVar9 = fs->bcbase;
  (o->str).hash = uVar4;
  o[1].gch.nextgc.gcptr32 = (uint)bVar17 + (uint)bVar17 * 2 + (uint)bVar21 * 0x100 + 0x59;
  if (1 < (ulong)uVar4) {
    lVar20 = 0;
    do {
      *(BCIns *)((long)o + lVar20 * 4 + 0x44) = pBVar9[lVar20 + 1].ins;
      lVar20 = lVar20 + 1;
    } while ((ulong)uVar4 - 1 != lVar20);
  }
  uVar4 = fs->nkn;
  if ((uVar4 < 0x10001) && (uVar14 = fs->nkgc, uVar14 < 0x10001)) {
    (o->gch).metatable.gcptr32 = (uint32_t)lVar2;
    (o->pt).sizekn = uVar4;
    (o->pt).sizekgc = uVar14;
    pGVar11 = fs->kt;
    if (pGVar11->asize != 0) {
      uVar32 = (ulong)(pGVar11->array).ptr32;
      uVar23 = 0;
      do {
        if (*(int *)(uVar32 + 4 + uVar23 * 8) == 0) {
          *(double *)(lVar2 + (ulong)*(uint *)(uVar32 + uVar23 * 8) * 8) =
               (double)(uVar23 & 0xffffffff);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < pGVar11->asize);
    }
    lVar20 = (ulong)uVar13 * 8;
    uVar23 = (ulong)(pGVar11->node).ptr32;
    uVar4 = pGVar11->hmask;
    uVar32 = 0;
    do {
      if (*(int *)(uVar23 + 4 + uVar32 * 0x18) == 0) {
        puVar3 = (uint *)(uVar23 + uVar32 * 0x18);
        if (puVar3[3] < 0xfffeffff) {
          *(undefined8 *)(lVar2 + (ulong)*puVar3 * 8) = *(undefined8 *)(puVar3 + 2);
        }
        else {
          v = (GCobj *)(ulong)puVar3[2];
          *(uint *)(lVar2 + ~(ulong)*puVar3 * 4) = puVar3[2];
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(ulong)(fs->L->glref).ptr32,o,v);
          }
          if ((puVar3[3] == 0xfffffff8) && (bVar17 = (v->pt).sizeuv, (ulong)bVar17 != 0)) {
            pVVar10 = fs->ls->vstack;
            uVar13 = (v->uv).dhash;
            uVar27 = 0;
            do {
              uVar28 = *(ushort *)((ulong)uVar13 + uVar27 * 2);
              if (uVar28 < 0xffc4) {
                bVar21 = pVVar10[uVar28].slot;
                if ((pVVar10[uVar28].info & 1) == 0) {
                  uVar28 = bVar21 | 0xc000;
                }
                else {
                  uVar28 = bVar21 | 0x8000;
                }
              }
              else {
                uVar28 = uVar28 + 0x3c;
              }
              *(ushort *)((ulong)uVar13 + uVar27 * 2) = uVar28;
              uVar27 = uVar27 + 1;
            } while (bVar17 != uVar27);
          }
        }
      }
      uVar13 = (int)uVar32 + 1;
      uVar32 = (ulong)uVar13;
    } while (uVar13 <= uVar4);
    pvVar30 = (void *)(lVar35 + (long)o);
    (o->uv).dhash = (uint32_t)pvVar30;
    bVar17 = fs->nuv;
    (o->pt).sizeuv = bVar17;
    memcpy(pvVar30,fs->uvtmp,(ulong)((uint)bVar17 * 2));
    iVar24 = fs->linedefined;
    uVar32 = (ulong)((fs->pc - 1) + (uint)(fs->pc == 1));
    pBVar9 = fs->bcbase;
    (o->pt).firstline = iVar24;
    (o->pt).numline = iVar31;
    (o->pt).lineinfo.ptr32 = (int)lVar16 + (uint32_t)o;
    if (iVar31 < 0x100) {
      uVar23 = 0;
      do {
        *(char *)((long)o + uVar23 + uVar22 + lVar20 + uVar19) =
             (char)pBVar9[uVar23 + 1].line - (char)iVar24;
        uVar23 = uVar23 + 1;
      } while (uVar32 != uVar23);
    }
    else if (iVar31 < 0x10000) {
      uVar23 = 0;
      do {
        *(short *)((long)o + uVar23 * 2 + uVar22 + lVar20 + uVar19) =
             (short)pBVar9[uVar23 + 1].line - (short)iVar24;
        uVar23 = uVar23 + 1;
      } while (uVar32 != uVar23);
    }
    else {
      uVar23 = 0;
      do {
        *(BCLine *)((long)o + uVar23 * 4 + uVar22 + lVar20 + uVar19) =
             pBVar9[uVar23 + 1].line - iVar24;
        uVar23 = uVar23 + 1;
      } while (uVar32 != uVar23);
    }
    pvVar30 = (void *)((long)o + lVar34);
    MVar29 = (MSize)pvVar30;
    (o->th).stacksize = MVar29;
    (o->pt).varinfo.ptr32 = (uVar5 - uVar6) + MVar29;
    uVar4 = (ls->sb).b.ptr32;
    memcpy(pvVar30,(void *)(ulong)uVar4,(ulong)((ls->sb).p.ptr32 - uVar4));
    if (((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar12 = L->top;
      L->top = pTVar12 + 1;
      (pTVar12->u32).lo = (uint32_t)o;
      (pTVar12->field_2).it = 0xfffffff8;
      lj_vmevent_call(L,argbase);
    }
    lj_memprof_add_proto(&o->pt);
    lj_sysprof_add_proto(&o->pt);
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif
#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}